

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<false>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  byte bVar12;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar13;
  long lVar14;
  byte bVar15;
  _func_int **pp_Var16;
  ulong uVar17;
  byte bVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float fVar33;
  undefined1 auVar34 [64];
  undefined4 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  float fVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  long lStack_24e0;
  StackItemT<embree::NodeRefPtr<8>_> *local_24d8;
  int mask;
  ulong local_24c8;
  RayHit *local_24c0;
  RayQueryContext *local_24b8;
  long local_24b0;
  long local_24a8;
  RTCIntersectFunctionNArguments local_24a0;
  Geometry *local_2470;
  undefined8 local_2468;
  RTCIntersectArguments *local_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_24d8 = stack + 1;
    stack[0].dist = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar23._8_4_ = 0x7fffffff;
    auVar23._0_8_ = 0x7fffffff7fffffff;
    auVar23._12_4_ = 0x7fffffff;
    auVar23 = vandps_avx512vl((undefined1  [16])aVar1,auVar23);
    auVar37._8_4_ = 0x219392ef;
    auVar37._0_8_ = 0x219392ef219392ef;
    auVar37._12_4_ = 0x219392ef;
    uVar17 = vcmpps_avx512vl(auVar23,auVar37,1);
    bVar22 = (bool)((byte)uVar17 & 1);
    auVar24._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * (int)aVar1.x;
    bVar22 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar24._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * (int)aVar1.y;
    bVar22 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar24._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * (int)aVar1.z;
    bVar22 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar24._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * aVar1.field_3.a;
    auVar23 = vrcp14ps_avx512vl(auVar24);
    auVar25._8_4_ = 0x3f800000;
    auVar25._0_8_ = 0x3f8000003f800000;
    auVar25._12_4_ = 0x3f800000;
    auVar25 = vfnmadd213ps_avx512vl(auVar24,auVar23,auVar25);
    auVar24 = vfmadd132ps_fma(auVar25,auVar23,auVar23);
    fVar33 = auVar24._0_4_;
    local_2398._4_4_ = fVar33;
    local_2398._0_4_ = fVar33;
    local_2398._8_4_ = fVar33;
    local_2398._12_4_ = fVar33;
    local_2398._16_4_ = fVar33;
    local_2398._20_4_ = fVar33;
    local_2398._24_4_ = fVar33;
    local_2398._28_4_ = fVar33;
    auVar41 = ZEXT3264(local_2398);
    auVar23 = vmovshdup_avx(auVar24);
    uVar36 = auVar23._0_8_;
    local_23b8._8_8_ = uVar36;
    local_23b8._0_8_ = uVar36;
    local_23b8._16_8_ = uVar36;
    local_23b8._24_8_ = uVar36;
    auVar42 = ZEXT3264(local_23b8);
    auVar25 = vshufpd_avx(auVar24,auVar24,1);
    auVar27._8_4_ = 2;
    auVar27._0_8_ = 0x200000002;
    auVar27._12_4_ = 2;
    auVar27._16_4_ = 2;
    auVar27._20_4_ = 2;
    auVar27._24_4_ = 2;
    auVar27._28_4_ = 2;
    fVar39 = fVar33 * (ray->super_RayK<1>).org.field_0.m128[0];
    local_23d8 = vpermps_avx2(auVar27,ZEXT1632(auVar24));
    auVar43 = ZEXT3264(local_23d8);
    auVar26._8_4_ = 1;
    auVar26._0_8_ = 0x100000001;
    auVar26._12_4_ = 1;
    auVar26._16_4_ = 1;
    auVar26._20_4_ = 1;
    auVar26._24_4_ = 1;
    auVar26._28_4_ = 1;
    auVar40 = ZEXT1632(CONCAT412(auVar24._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar24._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar24._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar39))
                                ));
    auVar26 = vpermps_avx2(auVar26,auVar40);
    auVar27 = vpermps_avx2(auVar27,auVar40);
    local_24c8 = (ulong)(fVar33 < 0.0) << 5;
    uVar21 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
    uVar17 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x80;
    uVar20 = local_24c8 ^ 0x20;
    uVar35 = auVar8._0_4_;
    auVar34 = ZEXT3264(CONCAT428(uVar35,CONCAT424(uVar35,CONCAT420(uVar35,CONCAT416(uVar35,CONCAT412
                                                  (uVar35,CONCAT48(uVar35,CONCAT44(uVar35,uVar35))))
                                                  ))));
    local_23f8._0_8_ = CONCAT44(fVar39,fVar39) ^ 0x8000000080000000;
    local_23f8._8_4_ = -fVar39;
    local_23f8._12_4_ = -fVar39;
    local_23f8._16_4_ = -fVar39;
    local_23f8._20_4_ = -fVar39;
    local_23f8._24_4_ = -fVar39;
    local_23f8._28_4_ = -fVar39;
    auVar44 = ZEXT3264(local_23f8);
    local_2418._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
    local_2418._8_4_ = auVar26._8_4_ ^ 0x80000000;
    local_2418._12_4_ = auVar26._12_4_ ^ 0x80000000;
    local_2418._16_4_ = auVar26._16_4_ ^ 0x80000000;
    local_2418._20_4_ = auVar26._20_4_ ^ 0x80000000;
    local_2418._24_4_ = auVar26._24_4_ ^ 0x80000000;
    local_2418._28_4_ = auVar26._28_4_ ^ 0x80000000;
    auVar45 = ZEXT3264(local_2418);
    local_2438._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
    local_2438._8_4_ = auVar27._8_4_ ^ 0x80000000;
    local_2438._12_4_ = auVar27._12_4_ ^ 0x80000000;
    local_2438._16_4_ = auVar27._16_4_ ^ 0x80000000;
    local_2438._20_4_ = auVar27._20_4_ ^ 0x80000000;
    local_2438._24_4_ = auVar27._24_4_ ^ 0x80000000;
    local_2438._28_4_ = auVar27._28_4_ ^ 0x80000000;
    auVar46 = ZEXT3264(local_2438);
    local_2458 = vbroadcastss_avx512vl(auVar7);
    auVar47 = ZEXT3264(local_2458);
    auVar26 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar48 = ZEXT3264(auVar26);
    auVar26 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar49 = ZEXT3264(auVar26);
    local_24c0 = ray;
    local_24b8 = context;
LAB_01c7a3aa:
    if (local_24d8 != stack) {
      pSVar13 = local_24d8 + -1;
      local_24d8 = local_24d8 + -1;
      if ((float)pSVar13->dist <= (ray->super_RayK<1>).tfar) {
        sVar19 = (local_24d8->ptr).ptr;
LAB_01c7a3d7:
        do {
          if ((sVar19 & 8) != 0) goto LAB_01c7a747;
          auVar7 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar19 + 0x40 + local_24c8),auVar44._0_32_
                                   ,auVar41._0_32_);
          auVar8 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar19 + 0x40 + uVar21),auVar45._0_32_,
                                   auVar42._0_32_);
          auVar26 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar8));
          auVar7 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar19 + 0x40 + uVar17),auVar46._0_32_,
                                   auVar43._0_32_);
          auVar27 = vpmaxsd_avx512vl(ZEXT1632(auVar7),auVar47._0_32_);
          auVar26 = vpmaxsd_avx2(auVar26,auVar27);
          auVar7 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar19 + 0x40 + uVar20),auVar44._0_32_,
                                   auVar41._0_32_);
          auVar8 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar19 + 0x40 + (uVar21 ^ 0x20)),
                                   auVar45._0_32_,auVar42._0_32_);
          auVar27 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar8));
          auVar7 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar19 + 0x40 + (uVar17 ^ 0x20)),
                                   auVar46._0_32_,auVar43._0_32_);
          auVar40 = vpminsd_avx2(ZEXT1632(auVar7),auVar34._0_32_);
          auVar27 = vpminsd_avx2(auVar27,auVar40);
          uVar11 = vpcmpd_avx512vl(auVar26,auVar27,2);
          bVar18 = (byte)uVar11;
          if (bVar18 == 0) break;
          auVar27 = *(undefined1 (*) [32])(sVar19 & 0xfffffffffffffff0);
          auVar40 = ((undefined1 (*) [32])(sVar19 & 0xfffffffffffffff0))[1];
          auVar28 = vmovdqa64_avx512vl(auVar48._0_32_);
          auVar28 = vpternlogd_avx512vl(auVar28,auVar26,auVar49._0_32_,0xf8);
          auVar29 = vpcompressd_avx512vl(auVar28);
          auVar30._0_4_ =
               (uint)(bVar18 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar28._0_4_;
          bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar30._4_4_ = (uint)bVar22 * auVar29._4_4_ | (uint)!bVar22 * auVar28._4_4_;
          bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar30._8_4_ = (uint)bVar22 * auVar29._8_4_ | (uint)!bVar22 * auVar28._8_4_;
          bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar30._12_4_ = (uint)bVar22 * auVar29._12_4_ | (uint)!bVar22 * auVar28._12_4_;
          bVar22 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar30._16_4_ = (uint)bVar22 * auVar29._16_4_ | (uint)!bVar22 * auVar28._16_4_;
          bVar22 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar30._20_4_ = (uint)bVar22 * auVar29._20_4_ | (uint)!bVar22 * auVar28._20_4_;
          bVar22 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar30._24_4_ = (uint)bVar22 * auVar29._24_4_ | (uint)!bVar22 * auVar28._24_4_;
          bVar22 = SUB81(uVar11 >> 7,0);
          auVar30._28_4_ = (uint)bVar22 * auVar29._28_4_ | (uint)!bVar22 * auVar28._28_4_;
          auVar28 = vpermt2q_avx512vl(auVar27,auVar30,auVar40);
          sVar19 = auVar28._0_8_;
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 != 0) {
            auVar28 = vpshufd_avx2(auVar30,0x55);
            vpermt2q_avx512vl(auVar27,auVar28,auVar40);
            auVar29 = vpminsd_avx2(auVar30,auVar28);
            auVar28 = vpmaxsd_avx2(auVar30,auVar28);
            bVar18 = bVar18 - 1 & bVar18;
            if (bVar18 == 0) {
              auVar30 = vpermi2q_avx512vl(auVar29,auVar27,auVar40);
              sVar19 = auVar30._0_8_;
              auVar27 = vpermt2q_avx512vl(auVar27,auVar28,auVar40);
              (local_24d8->ptr).ptr = auVar27._0_8_;
              lVar14 = 8;
              lStack_24e0 = 0x10;
            }
            else {
              auVar10 = vpshufd_avx2(auVar30,0xaa);
              vpermt2q_avx512vl(auVar27,auVar10,auVar40);
              auVar32 = vpminsd_avx2(auVar29,auVar10);
              auVar29 = vpmaxsd_avx2(auVar29,auVar10);
              auVar10 = vpminsd_avx2(auVar28,auVar29);
              auVar29 = vpmaxsd_avx2(auVar28,auVar29);
              bVar18 = bVar18 - 1 & bVar18;
              if (bVar18 == 0) {
                auVar28 = vpermi2q_avx512vl(auVar32,auVar27,auVar40);
                sVar19 = auVar28._0_8_;
                auVar28 = vpermt2q_avx512vl(auVar27,auVar29,auVar40);
                (local_24d8->ptr).ptr = auVar28._0_8_;
                auVar28 = vpermd_avx2(auVar29,auVar26);
                local_24d8->dist = auVar28._0_4_;
                auVar27 = vpermt2q_avx512vl(auVar27,auVar10,auVar40);
                local_24d8[1].ptr.ptr = auVar27._0_8_;
                lStack_24e0 = 0x18;
                lVar14 = lStack_24e0;
                lStack_24e0 = 0x20;
                auVar28 = auVar10;
              }
              else {
                auVar28 = vpshufd_avx2(auVar30,0xff);
                vpermt2q_avx512vl(auVar27,auVar28,auVar40);
                auVar9 = vpminsd_avx2(auVar32,auVar28);
                auVar32 = vpmaxsd_avx2(auVar32,auVar28);
                auVar28 = vpminsd_avx2(auVar10,auVar32);
                auVar32 = vpmaxsd_avx2(auVar10,auVar32);
                auVar10 = vpminsd_avx2(auVar29,auVar32);
                auVar29 = vpmaxsd_avx2(auVar29,auVar32);
                bVar18 = bVar18 - 1 & bVar18;
                if (bVar18 != 0) {
                  auVar31 = valignd_avx512vl(auVar30,auVar30,3);
                  auVar30 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar32 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar30,auVar9);
                  auVar30 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar28 = vpermt2d_avx512vl(auVar32,auVar30,auVar28);
                  auVar30 = vpermt2d_avx512vl(auVar28,auVar30,auVar10);
                  auVar28 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar28 = vpermt2d_avx512vl(auVar30,auVar28,auVar29);
                  auVar38 = ZEXT3264(auVar28);
                  bVar15 = bVar18;
                  do {
                    auVar30 = auVar38._0_32_;
                    auVar28._8_4_ = 1;
                    auVar28._0_8_ = 0x100000001;
                    auVar28._12_4_ = 1;
                    auVar28._16_4_ = 1;
                    auVar28._20_4_ = 1;
                    auVar28._24_4_ = 1;
                    auVar28._28_4_ = 1;
                    auVar28 = vpermd_avx2(auVar28,auVar31);
                    auVar31 = valignd_avx512vl(auVar31,auVar31,1);
                    vpermt2q_avx512vl(auVar27,auVar31,auVar40);
                    bVar15 = bVar15 - 1 & bVar15;
                    uVar36 = vpcmpd_avx512vl(auVar28,auVar30,5);
                    auVar28 = vpmaxsd_avx2(auVar28,auVar30);
                    bVar12 = (byte)uVar36 << 1;
                    auVar30 = valignd_avx512vl(auVar30,auVar30,7);
                    bVar22 = (bool)((byte)uVar36 & 1);
                    bVar2 = (bool)(bVar12 >> 2 & 1);
                    bVar3 = (bool)(bVar12 >> 3 & 1);
                    bVar4 = (bool)(bVar12 >> 4 & 1);
                    bVar5 = (bool)(bVar12 >> 5 & 1);
                    bVar6 = (bool)(bVar12 >> 6 & 1);
                    auVar38 = ZEXT3264(CONCAT428((uint)(bVar12 >> 7) * auVar30._28_4_ |
                                                 (uint)!(bool)(bVar12 >> 7) * auVar28._28_4_,
                                                 CONCAT424((uint)bVar6 * auVar30._24_4_ |
                                                           (uint)!bVar6 * auVar28._24_4_,
                                                           CONCAT420((uint)bVar5 * auVar30._20_4_ |
                                                                     (uint)!bVar5 * auVar28._20_4_,
                                                                     CONCAT416((uint)bVar4 *
                                                                               auVar30._16_4_ |
                                                                               (uint)!bVar4 *
                                                                               auVar28._16_4_,
                                                                               CONCAT412((uint)bVar3
                                                                                         * auVar30.
                                                  _12_4_ | (uint)!bVar3 * auVar28._12_4_,
                                                  CONCAT48((uint)bVar2 * auVar30._8_4_ |
                                                           (uint)!bVar2 * auVar28._8_4_,
                                                           CONCAT44((uint)bVar22 * auVar30._4_4_ |
                                                                    (uint)!bVar22 * auVar28._4_4_,
                                                                    auVar28._0_4_))))))));
                  } while (bVar15 != 0);
                  lVar14 = (ulong)(uint)POPCOUNT((uint)bVar18) + 3;
                  while( true ) {
                    auVar30 = auVar38._0_32_;
                    auVar28 = vpermt2q_avx512vl(auVar27,auVar30,auVar40);
                    sVar19 = auVar28._0_8_;
                    bVar22 = lVar14 == 0;
                    lVar14 = lVar14 + -1;
                    if (bVar22) break;
                    (local_24d8->ptr).ptr = sVar19;
                    auVar28 = vpermd_avx2(auVar30,auVar26);
                    local_24d8->dist = auVar28._0_4_;
                    auVar28 = valignd_avx512vl(auVar30,auVar30,1);
                    auVar38 = ZEXT3264(auVar28);
                    local_24d8 = local_24d8 + 1;
                  }
                  goto LAB_01c7a3d7;
                }
                auVar30 = vpermi2q_avx512vl(auVar9,auVar27,auVar40);
                sVar19 = auVar30._0_8_;
                auVar30 = vpermt2q_avx512vl(auVar27,auVar29,auVar40);
                (local_24d8->ptr).ptr = auVar30._0_8_;
                auVar30 = vpermd_avx2(auVar29,auVar26);
                local_24d8->dist = auVar30._0_4_;
                auVar30 = vpermt2q_avx512vl(auVar27,auVar10,auVar40);
                local_24d8[1].ptr.ptr = auVar30._0_8_;
                auVar30 = vpermd_avx2(auVar10,auVar26);
                local_24d8[1].dist = auVar30._0_4_;
                auVar27 = vpermt2q_avx512vl(auVar27,auVar28,auVar40);
                local_24d8[2].ptr.ptr = auVar27._0_8_;
                lVar14 = 0x28;
                lStack_24e0 = 0x30;
              }
            }
            auVar26 = vpermd_avx2(auVar28,auVar26);
            *(int *)((long)&(local_24d8->ptr).ptr + lVar14) = auVar26._0_4_;
            local_24d8 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_24d8->ptr).ptr + lStack_24e0);
          }
        } while( true );
      }
      goto LAB_01c7a3aa;
    }
  }
  return;
LAB_01c7a747:
  local_24b0 = (ulong)((uint)sVar19 & 0xf) - 8;
  for (local_24a8 = 0; local_24b0 != local_24a8; local_24a8 = local_24a8 + 1) {
    local_24a0.geomID = *(uint *)((sVar19 & 0xfffffffffffffff0) + local_24a8 * 8);
    local_2470 = (context->scene->geometries).items[local_24a0.geomID].ptr;
    if (((ray->super_RayK<1>).mask & local_2470->mask) != 0) {
      local_24a0.primID = *(uint *)((sVar19 & 0xfffffffffffffff0) + 4 + local_24a8 * 8);
      mask = -1;
      local_24a0.valid = &mask;
      local_24a0.geometryUserPtr = local_2470->userPtr;
      local_24a0.context = context->user;
      local_24a0.N = 1;
      local_2468 = 0;
      local_2460 = context->args;
      pp_Var16 = (_func_int **)local_2460->intersect;
      if (pp_Var16 == (_func_int **)0x0) {
        pp_Var16 = local_2470[1].super_RefCount._vptr_RefCount;
      }
      local_24a0.rayhit = (RTCRayHitN *)ray;
      (*(code *)pp_Var16)(&local_24a0);
      auVar41 = ZEXT3264(local_2398);
      auVar42 = ZEXT3264(local_23b8);
      auVar43 = ZEXT3264(local_23d8);
      auVar44 = ZEXT3264(local_23f8);
      auVar45 = ZEXT3264(local_2418);
      auVar46 = ZEXT3264(local_2438);
      auVar47 = ZEXT3264(local_2458);
      auVar26 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar48 = ZEXT3264(auVar26);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar49 = ZEXT3264(auVar26);
      context = local_24b8;
      ray = local_24c0;
    }
  }
  fVar33 = (ray->super_RayK<1>).tfar;
  auVar34 = ZEXT3264(CONCAT428(fVar33,CONCAT424(fVar33,CONCAT420(fVar33,CONCAT416(fVar33,CONCAT412(
                                                  fVar33,CONCAT48(fVar33,CONCAT44(fVar33,fVar33)))))
                                               )));
  goto LAB_01c7a3aa;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }